

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# worm.c
# Opt level: O0

int get_wormno(level *lev)

{
  int local_1c;
  int new_wormno;
  level *lev_local;
  
  local_1c = 1;
  while( true ) {
    if (0x1f < local_1c) {
      return 0;
    }
    if (lev->wheads[local_1c] == (wseg *)0x0) break;
    local_1c = local_1c + 1;
  }
  return local_1c;
}

Assistant:

int get_wormno(struct level *lev)
{
    int new_wormno = 1;

    while (new_wormno < MAX_NUM_WORMS) {
	if (!lev->wheads[new_wormno])
	    return new_wormno; /* found an empty wtails[] slot at new_wormno */
	new_wormno++;
    }

    return 0;	/* level infested with worms */
}